

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O3

FName __thiscall FSkillInfo::GetReplacedBy(FSkillInfo *this,FName *b)

{
  uint *puVar1;
  Node *pNVar2;
  long *plVar3;
  int iVar4;
  uint *in_RDX;
  FName local_c;
  
  local_c.Index = *in_RDX;
  plVar3 = (long *)((ulong)(b[0x32].Index - 1U & local_c.Index) * 0x10 + *(long *)(b + 0x2e));
  do {
    iVar4 = 0;
    if ((plVar3 == (long *)0x0) || (iVar4 = 0, (long *)*plVar3 == (long *)0x1)) goto LAB_003969ad;
    puVar1 = (uint *)(plVar3 + 1);
    plVar3 = (long *)*plVar3;
  } while (*puVar1 != local_c.Index);
  pNVar2 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::GetNode
                     ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(b + 0x2e),
                      &local_c);
  iVar4 = (pNVar2->Pair).Value.Index;
LAB_003969ad:
  (this->Name).Index = iVar4;
  return (FName)(int)this;
}

Assistant:

FName FSkillInfo::GetReplacedBy(FName b)
{
	if (Replaced.CheckKey(b)) return Replaced[b];
	else return NAME_None;
}